

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

uint64_t get_random(void)

{
  __time_t _Var1;
  long lVar2;
  timespec tsnow;
  timespec local_28;
  
  clock_gettime(0,&local_28);
  lVar2 = local_28.tv_nsec;
  _Var1 = local_28.tv_sec;
  if (get_random::lfsr == 0) {
    clock_gettime(0,&local_28);
    get_random::lfsr = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    clock_gettime(0,&local_28);
    get_random::lcg = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  }
  else {
    get_random::lfsr =
         (ulong)((uint)(get_random::lfsr >> 1) & 0x7fffffff ^ (uint)get_random::lfsr ^
                (uint)(get_random::lfsr >> 4) & 0xfffffff ^
                (uint)(get_random::lfsr >> 3) & 0x1fffffff) << 0x3f | get_random::lfsr >> 1;
    get_random::lcg = get_random::lcg * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  }
  return _Var1 * 1000000000 + lVar2 ^ get_random::lcg ^ get_random::lfsr;
}

Assistant:

static uint64_t
get_random(void)
{
	static uint64_t lfsr = 0; /* Linear feedback shift register */
	static uint64_t lcg = 0;  /* Linear congruential generator */
	uint64_t now = mg_get_current_time_ns();

	if (lfsr == 0) {
		/* lfsr will be only 0 if has not been initialized,
		 * so this code is called only once. */
		lfsr = mg_get_current_time_ns();
		lcg = mg_get_current_time_ns();
	} else {
		/* Get the next step of both random number generators. */
		lfsr = (lfsr >> 1)
		       | ((((lfsr >> 0) ^ (lfsr >> 1) ^ (lfsr >> 3) ^ (lfsr >> 4)) & 1)
		          << 63);
		lcg = lcg * 6364136223846793005LL + 1442695040888963407LL;
	}

	/* Combining two pseudo-random number generators and a high resolution
	 * part
	 * of the current server time will make it hard (impossible?) to guess
	 * the
	 * next number. */
	return (lfsr ^ lcg ^ now);
}